

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_ref.cpp
# Opt level: O2

string * __thiscall
duckdb::ColumnDataRef::ToString_abi_cxx11_(string *__return_storage_ptr__,ColumnDataRef *this)

{
  ColumnDataCollection *this_00;
  string result;
  string sStack_58;
  string local_38;
  
  this_00 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(&this->collection);
  ColumnDataCollection::ToString_abi_cxx11_(&local_38,this_00);
  ::std::__cxx11::string::string((string *)&sStack_58,(string *)&local_38);
  TableRef::BaseToString
            (__return_storage_ptr__,&this->super_TableRef,&sStack_58,&this->expected_names);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string ColumnDataRef::ToString() const {
	auto result = collection->ToString();
	return BaseToString(result, expected_names);
}